

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

FunctionInfo *
Js::DynamicProfileInfo::GetFunctionInfo
          (FunctionBody *functionBody,SourceId sourceId,LocalFunctionId functionId)

{
  int iVar1;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar2;
  Utf8SourceInfo *pUVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  ThreadContext *pTVar7;
  undefined4 *puVar8;
  undefined7 extraout_var;
  FunctionInfo *pFVar9;
  ScriptContext *pSVar10;
  Type *pTVar11;
  DWORD_PTR DVar12;
  FunctionBody *pFVar13;
  int iVar14;
  ThreadContext *local_40;
  
  pTVar7 = ThreadContext::GetContextForCurrentThread();
  if (pTVar7 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x413,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    pTVar7 = (ThreadContext *)CONCAT71(extraout_var,bVar6);
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (sourceId == 0xfffffffb) {
    pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pLVar2 = (pSVar10->sourceList).ptr;
    iVar14 = (pLVar2->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).count;
    bVar6 = 0 < iVar14;
    if (0 < iVar14) {
      iVar14 = 0;
      do {
        pTVar11 = JsUtil::
                  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                  ::Item(pLVar2,iVar14);
        if (((ulong)pTVar11->ptr & 1) == 0 &&
            pTVar11->ptr != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
          pTVar11 = JsUtil::
                    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    ::Item(pLVar2,iVar14);
          pUVar3 = (Utf8SourceInfo *)(pTVar11->ptr->super_RecyclerWeakReferenceBase).strongRef;
          bVar5 = true;
          if ((pUVar3 != (Utf8SourceInfo *)0x0) &&
             (DVar12 = Utf8SourceInfo::GetHostSourceContext(pUVar3), DVar12 == 0xfffffffffffffffe))
          {
            pFVar13 = Utf8SourceInfo::FindFunction(pUVar3,functionId);
            if (pFVar13 == (FunctionBody *)0x0) {
              bVar5 = false;
              local_40 = (ThreadContext *)0x0;
            }
            else {
              local_40 = (ThreadContext *)
                         (pFVar13->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
              ;
              bVar5 = false;
            }
          }
          if (!bVar5) break;
        }
        iVar14 = iVar14 + 1;
        iVar1 = (pLVar2->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count;
        bVar6 = iVar14 < iVar1;
      } while (iVar14 < iVar1);
    }
    if (bVar6) {
      return (FunctionInfo *)local_40;
    }
  }
  else {
    if (sourceId == 0xfffffffd) {
      pFVar13 = Utf8SourceInfo::FindFunction
                          ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                           m_utf8SourceInfo.ptr,functionId);
      if (pFVar13 == (FunctionBody *)0x0) {
        return (FunctionInfo *)0x0;
      }
      return (pFVar13->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    local_40 = pTVar7;
    if (sourceId == 0xfffffffe) {
      pFVar9 = JavascriptBuiltInFunction::GetFunctionInfo(functionId);
      return pFVar9;
    }
  }
  if ((sourceId != 0xfffffffc) && (sourceId != 0xffffffff)) {
    pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pLVar2 = (pSVar10->sourceList).ptr;
    iVar14 = (pLVar2->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).count;
    bVar6 = 0 < iVar14;
    if (0 < iVar14) {
      iVar14 = 0;
      do {
        pTVar11 = JsUtil::
                  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                  ::Item(pLVar2,iVar14);
        if (((ulong)pTVar11->ptr & 1) == 0 &&
            pTVar11->ptr != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
          pTVar11 = JsUtil::
                    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    ::Item(pLVar2,iVar14);
          pUVar3 = (Utf8SourceInfo *)(pTVar11->ptr->super_RecyclerWeakReferenceBase).strongRef;
          bVar5 = true;
          if ((pUVar3 != (Utf8SourceInfo *)0x0) &&
             (DVar12 = Utf8SourceInfo::GetHostSourceContext(pUVar3), DVar12 == sourceId)) {
            pFVar13 = Utf8SourceInfo::FindFunction(pUVar3,functionId);
            if (pFVar13 == (FunctionBody *)0x0) {
              bVar5 = false;
              local_40 = (ThreadContext *)0x0;
            }
            else {
              local_40 = (ThreadContext *)
                         (pFVar13->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
              ;
              bVar5 = false;
            }
          }
          if (!bVar5) break;
        }
        iVar14 = iVar14 + 1;
        iVar1 = (pLVar2->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count;
        bVar6 = iVar14 < iVar1;
      } while (iVar14 < iVar1);
    }
    if (bVar6) {
      return (FunctionInfo *)local_40;
    }
  }
  return (FunctionInfo *)0x0;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetFunctionInfo(FunctionBody* functionBody, Js::SourceId sourceId, Js::LocalFunctionId functionId)
    {
        Assert(ThreadContext::GetContextForCurrentThread());
        if (sourceId == BuiltInSourceId)
        {
            return JavascriptBuiltInFunction::GetFunctionInfo(functionId);
        }

        if (sourceId == CurrentSourceId) // caller and callee in same file
        {
            FunctionProxy *inlineeProxy = functionBody->GetUtf8SourceInfo()->FindFunction(functionId);
            return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
        }

        if (sourceId == JsBuiltInSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        if (inlineeProxy)
                        {
                            return inlineeProxy->GetFunctionInfo();
                        }
                        else
                        {
                            return nullptr;
                        }
                    }
                }
            }
        }

        if (sourceId != NoSourceId && sourceId != InvalidSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == sourceId)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
                    }
                }
            }
        }

        return nullptr;
    }